

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

void Amap_LibWritePin(FILE *pFile,Amap_Pin_t *pPin)

{
  undefined8 local_68;
  char *pPhaseNames [10];
  Amap_Pin_t *pPin_local;
  FILE *pFile_local;
  
  pPhaseNames[9] = (char *)pPin;
  memcpy(&local_68,&DAT_00f999f0,0x50);
  fprintf((FILE *)pFile,"    PIN ");
  fprintf((FILE *)pFile,"%9s ",*(undefined8 *)pPhaseNames[9]);
  fprintf((FILE *)pFile,"%10s ",pPhaseNames[(long)*(int *)(pPhaseNames[9] + 8) + -1]);
  fprintf((FILE *)pFile,"%6d ",(ulong)(uint)(int)*(double *)(pPhaseNames[9] + 0x10));
  fprintf((FILE *)pFile,"%6d ",(ulong)(uint)(int)*(double *)(pPhaseNames[9] + 0x18));
  fprintf((FILE *)pFile,"%6.2f ",*(undefined8 *)(pPhaseNames[9] + 0x20));
  fprintf((FILE *)pFile,"%6.2f ",*(undefined8 *)(pPhaseNames[9] + 0x28));
  fprintf((FILE *)pFile,"%6.2f ",*(undefined8 *)(pPhaseNames[9] + 0x30));
  fprintf((FILE *)pFile,"%6.2f",*(undefined8 *)(pPhaseNames[9] + 0x38));
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Amap_LibWritePin( FILE * pFile, Amap_Pin_t * pPin )
{
    char * pPhaseNames[10] = { "UNKNOWN", "INV", "NONINV" };
    fprintf( pFile, "    PIN " );
    fprintf( pFile, "%9s ",     pPin->pName );
    fprintf( pFile, "%10s ",    pPhaseNames[pPin->Phase] );
    fprintf( pFile, "%6d ",     (int)pPin->dLoadInput );
    fprintf( pFile, "%6d ",     (int)pPin->dLoadMax );
    fprintf( pFile, "%6.2f ",   pPin->dDelayBlockRise );
    fprintf( pFile, "%6.2f ",   pPin->dDelayFanoutRise );
    fprintf( pFile, "%6.2f ",   pPin->dDelayBlockFall );
    fprintf( pFile, "%6.2f",    pPin->dDelayFanoutFall );
    fprintf( pFile, "\n" );
}